

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

void __thiscall Jupiter::IRC::Client::sendMessage(Client *this,string_view dest,string_view message)

{
  Socket *this_00;
  size_t sVar1;
  char *__n;
  string local_30;
  
  sVar1 = message._M_len;
  __n = dest._M_str;
  this_00 = (this->m_socket)._M_t.
            super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
            super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
            super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl;
  string_printf_abi_cxx11_(&local_30,"PRIVMSG %.*s :%.*s\r\n",dest._M_len,__n,sVar1,message._M_str);
  Socket::send(this_00,(int)local_30._M_string_length,local_30._M_dataplus._M_p,(size_t)__n,
               (int)sVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Jupiter::IRC::Client::sendMessage(std::string_view dest, std::string_view message) {
	m_socket->send(string_printf("PRIVMSG %.*s :%.*s" ENDL, dest.size(), dest.data(), message.size(), message.data()));
}